

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(monotonic_buffer_resource *this)

{
  monotonic_buffer_resource *in_RDI;
  
  ~monotonic_buffer_resource(in_RDI);
  operator_delete(in_RDI,0x60);
  return;
}

Assistant:

~monotonic_buffer_resource() { release(); }